

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiDockNode *local_58;
  ImGuiWindow *local_50;
  ImGuiWindow *local_48;
  ImGuiID local_38;
  bool active_id_window_is_dock_node_host;
  ImGuiDockNode *dock_node;
  ImGuiWindow *display_front_window;
  ImGuiWindow *focus_front_window;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar2 = GImGui;
  if (GImGui->NavWindow != window) {
    GImGui->NavWindow = window;
    if ((window != (ImGuiWindow *)0x0) && ((pIVar2->NavDisableMouseHover & 1U) != 0)) {
      pIVar2->NavMousePosDirty = true;
    }
    if (window == (ImGuiWindow *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = window->NavLastIds[0];
    }
    pIVar2->NavId = local_38;
    pIVar2->NavFocusScopeId = 0;
    pIVar2->NavIdIsAlive = false;
    pIVar2->NavLayer = ImGuiNavLayer_Main;
    pIVar2->NavMoveScoringItems = false;
    pIVar2->NavMoveSubmitted = false;
    pIVar2->NavInitRequest = false;
    NavUpdateAnyRequestFlag();
  }
  ClosePopupsOverWindow(window,false);
  bVar3 = true;
  if (window != (ImGuiWindow *)0x0) {
    bVar3 = window->RootWindowDockTree != (ImGuiWindow *)0x0;
  }
  if (!bVar3) {
    __assert_fail("window == __null || window->RootWindowDockTree != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x1c95,"void ImGui::FocusWindow(ImGuiWindow *)");
  }
  if (window == (ImGuiWindow *)0x0) {
    local_48 = (ImGuiWindow *)0x0;
    local_50 = (ImGuiWindow *)0x0;
    local_58 = (ImGuiDockNode *)0x0;
  }
  else {
    local_48 = window->RootWindow;
    local_50 = window->RootWindowDockTree;
    local_58 = window->DockNode;
  }
  bVar3 = false;
  if ((pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0) &&
     (bVar3 = false, local_58 != (ImGuiDockNode *)0x0)) {
    bVar3 = local_58->HostWindow == pIVar2->ActiveIdWindow;
  }
  if ((((pIVar2->ActiveId != 0) && (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
      (pIVar2->ActiveIdWindow->RootWindow != local_48)) &&
     (((pIVar2->ActiveIdNoClearOnFocusLoss & 1U) == 0 && (!bVar3)))) {
    ClearActiveID();
  }
  if (window != (ImGuiWindow *)0x0) {
    window->LastFrameJustFocused = pIVar2->FrameCount;
    if ((local_58 != (ImGuiDockNode *)0x0) && (local_58->TabBar != (ImGuiTabBar *)0x0)) {
      IVar1 = window->TabId;
      local_58->TabBar->NextSelectedTabId = IVar1;
      local_58->TabBar->SelectedTabId = IVar1;
    }
    BringWindowToFocusFront(local_48);
    if (((window->Flags | local_48->Flags | local_50->Flags) & 0x2000U) == 0) {
      BringWindowToDisplayFront(local_50);
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        g.NavWindow = window;
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavFocusScopeId = 0;
        g.NavIdIsAlive = false;
        g.NavLayer = ImGuiNavLayer_Main;
        g.NavInitRequest = g.NavMoveSubmitted = g.NavMoveScoringItems = false;
        NavUpdateAnyRequestFlag();
        //IMGUI_DEBUG_LOG("FocusWindow(\"%s\")\n", window ? window->Name : NULL);
    }

    // Close popups if any
    ClosePopupsOverWindow(window, false);

    // Move the root window to the top of the pile
    IM_ASSERT(window == NULL || window->RootWindowDockTree != NULL);
    ImGuiWindow* focus_front_window = window ? window->RootWindow : NULL;
    ImGuiWindow* display_front_window = window ? window->RootWindowDockTree : NULL;
    ImGuiDockNode* dock_node = window ? window->DockNode : NULL;
    bool active_id_window_is_dock_node_host = (g.ActiveIdWindow && dock_node && dock_node->HostWindow == g.ActiveIdWindow);

    // Steal active widgets. Some of the cases it triggers includes:
    // - Focus a window while an InputText in another window is active, if focus happens before the old InputText can run.
    // - When using Nav to activate menu items (due to timing of activating on press->new window appears->losing ActiveId)
    // - Using dock host items (tab, collapse button) can trigger this before we redirect the ActiveIdWindow toward the child window.
    if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != focus_front_window)
        if (!g.ActiveIdNoClearOnFocusLoss && !active_id_window_is_dock_node_host)
            ClearActiveID();

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;
    window->LastFrameJustFocused = g.FrameCount;

    // Select in dock node
    if (dock_node && dock_node->TabBar)
        dock_node->TabBar->SelectedTabId = dock_node->TabBar->NextSelectedTabId = window->TabId;

    // Bring to front
    BringWindowToFocusFront(focus_front_window);
    if (((window->Flags | focus_front_window->Flags | display_front_window->Flags) & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
        BringWindowToDisplayFront(display_front_window);
}